

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# const_folding_rules.cpp
# Opt level: O0

Constant *
spvtools::opt::anon_unknown_0::NegateFPConst
          (Type *result_type,Constant *val,ConstantManager *const_mgr)

{
  int iVar1;
  uint32_t uVar2;
  undefined4 extraout_var;
  float fVar3;
  double dVar4;
  double da;
  float fa;
  Float *float_type;
  ConstantManager *const_mgr_local;
  Constant *val_local;
  Type *result_type_local;
  Float *this;
  
  iVar1 = (*result_type->_vptr_Type[0xc])();
  this = (Float *)CONCAT44(extraout_var,iVar1);
  if (this != (Float *)0x0) {
    uVar2 = analysis::Float::width(this);
    if (uVar2 == 0x20) {
      fVar3 = analysis::Constant::GetFloat(val);
      result_type_local = (Type *)analysis::ConstantManager::GetFloatConst(const_mgr,-fVar3);
    }
    else {
      uVar2 = analysis::Float::width(this);
      if (uVar2 == 0x40) {
        dVar4 = analysis::Constant::GetDouble(val);
        result_type_local = (Type *)analysis::ConstantManager::GetDoubleConst(const_mgr,-dVar4);
      }
      else {
        result_type_local = (Type *)0x0;
      }
    }
    return (Constant *)result_type_local;
  }
  __assert_fail("float_type != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/const_folding_rules.cpp"
                ,0x50,
                "const analysis::Constant *spvtools::opt::(anonymous namespace)::NegateFPConst(const analysis::Type *, const analysis::Constant *, analysis::ConstantManager *)"
               );
}

Assistant:

const analysis::Constant* NegateFPConst(const analysis::Type* result_type,
                                        const analysis::Constant* val,
                                        analysis::ConstantManager* const_mgr) {
  const analysis::Float* float_type = result_type->AsFloat();
  assert(float_type != nullptr);
  if (float_type->width() == 32) {
    float fa = val->GetFloat();
    return const_mgr->GetFloatConst(-fa);
  } else if (float_type->width() == 64) {
    double da = val->GetDouble();
    return const_mgr->GetDoubleConst(-da);
  }
  return nullptr;
}